

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::updateStandaloneQualifierDefaults
          (TParseContext *this,TSourceLoc *loc,TPublicType *publicType)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  TLayoutGeometry TVar5;
  char *pcVar6;
  char *pcVar7;
  undefined4 extraout_var;
  TConstUnionArray *this_00;
  TConstUnion *this_01;
  undefined4 extraout_var_00;
  long *plVar8;
  long lVar9;
  TQualifier *this_02;
  bool bVar10;
  int local_158;
  int local_154;
  int local_150;
  int local_13c;
  int local_138;
  int local_134;
  TQualifier *qualifier;
  TVariable *workGroupSize_1;
  TVariable *workGroupSize;
  undefined1 local_90 [8];
  TString maxsErrtring_1;
  undefined1 local_60 [8];
  TString maxsErrtring;
  int max;
  int i;
  char *id_1;
  char *id;
  TPublicType *publicType_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  if ((publicType->shaderQualifiers).vertices != -1) {
    bVar10 = true;
    if (((this->super_TParseContextBase).super_TParseVersions.language != EShLangTessControl) &&
       (bVar10 = true,
       (this->super_TParseContextBase).super_TParseVersions.language != EShLangGeometry)) {
      bVar10 = (this->super_TParseContextBase).super_TParseVersions.language == EShLangMesh;
    }
    if (!bVar10) {
      __assert_fail("language == EShLangTessControl || language == EShLangGeometry || language == EShLangMesh"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                    ,0x2743,
                    "void glslang::TParseContext::updateStandaloneQualifierDefaults(const TSourceLoc &, const TPublicType &)"
                   );
    }
    pcVar6 = "max_vertices";
    if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangTessControl) {
      pcVar6 = "vertices";
    }
    if (((uint)*(undefined8 *)&(publicType->qualifier).field_0x8 & 0x7f) != 4) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to \'out\'",pcVar6,"");
    }
    bVar10 = TIntermediate::setVertices
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                        (publicType->shaderQualifiers).vertices);
    if (!bVar10) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot change previously set layout value",pcVar6,"");
    }
    if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangTessControl) {
      checkIoArraysConsistency(this,loc,false);
    }
  }
  if ((publicType->shaderQualifiers).primitives != -1) {
    if ((this->super_TParseContextBase).super_TParseVersions.language != EShLangMesh) {
      __assert_fail("language == EShLangMesh",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                    ,0x274f,
                    "void glslang::TParseContext::updateStandaloneQualifierDefaults(const TSourceLoc &, const TPublicType &)"
                   );
    }
    if (((uint)*(undefined8 *)&(publicType->qualifier).field_0x8 & 0x7f) != 4) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to \'out\'","max_primitives","");
    }
    bVar10 = TIntermediate::setPrimitives
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                        (publicType->shaderQualifiers).primitives);
    if (!bVar10) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot change previously set layout value","max_primitives","");
    }
  }
  if ((publicType->shaderQualifiers).invocations != -1) {
    if (((uint)*(undefined8 *)&(publicType->qualifier).field_0x8 & 0x7f) != 3) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to \'in\'","invocations","");
    }
    bVar10 = TIntermediate::setInvocations
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                        (publicType->shaderQualifiers).invocations);
    if (!bVar10) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot change previously set layout value","invocations","");
    }
  }
  if ((publicType->shaderQualifiers).geometry != ElgNone) {
    if (((uint)*(undefined8 *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      TVar5 = (publicType->shaderQualifiers).geometry;
      if (((TVar5 - ElgPoints < 3) || (TVar5 - ElgTriangles < 2)) ||
         (TVar5 == ElgQuads || TVar5 == ElgIsolines)) {
        if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangMesh) {
          pcVar6 = TQualifier::getGeometryString((publicType->shaderQualifiers).geometry);
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"cannot apply to input",pcVar6,"");
        }
        else {
          bVar10 = TIntermediate::setInputPrimitive
                             ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                              (publicType->shaderQualifiers).geometry);
          if (bVar10) {
            if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangGeometry) {
              checkIoArraysConsistency(this,loc,false);
            }
          }
          else {
            pcVar6 = TQualifier::getGeometryString((publicType->shaderQualifiers).geometry);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"cannot change previously set input primitive",pcVar6,"");
          }
        }
      }
      else {
        pcVar6 = TQualifier::getGeometryString((publicType->shaderQualifiers).geometry);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"cannot apply to input",pcVar6,"");
      }
    }
    else if (((uint)*(undefined8 *)&(publicType->qualifier).field_0x8 & 0x7f) == 4) {
      TVar5 = (publicType->shaderQualifiers).geometry;
      if (TVar5 != ElgPoints) {
        if (TVar5 == ElgLines) {
LAB_006aa2ec:
          if ((this->super_TParseContextBase).super_TParseVersions.language != EShLangMesh) {
            pcVar6 = TQualifier::getGeometryString((publicType->shaderQualifiers).geometry);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"cannot apply to \'out\'",pcVar6,"");
            goto LAB_006aa445;
          }
        }
        else if (TVar5 != ElgLineStrip) {
          if (TVar5 == ElgTriangles) goto LAB_006aa2ec;
          if (TVar5 != ElgTriangleStrip) {
            pcVar6 = TQualifier::getGeometryString((publicType->shaderQualifiers).geometry);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"cannot apply to \'out\'",pcVar6,"");
            goto LAB_006aa445;
          }
        }
      }
      bVar10 = TIntermediate::setOutputPrimitive
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                          (publicType->shaderQualifiers).geometry);
      if (!bVar10) {
        pcVar6 = TQualifier::getGeometryString((publicType->shaderQualifiers).geometry);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"cannot change previously set output primitive",pcVar6,"");
      }
    }
    else {
      pcVar6 = TQualifier::getGeometryString((publicType->shaderQualifiers).geometry);
      pcVar7 = GetStorageQualifierString
                         ((TStorageQualifier)*(undefined8 *)&(publicType->qualifier).field_0x8 &
                          0x7f);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot apply to:",pcVar6,pcVar7);
    }
  }
LAB_006aa445:
  if ((publicType->shaderQualifiers).spacing != EvsNone) {
    if (((uint)*(undefined8 *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      bVar10 = TIntermediate::setVertexSpacing
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                          (publicType->shaderQualifiers).spacing);
      if (!bVar10) {
        pcVar6 = TQualifier::getVertexSpacingString((publicType->shaderQualifiers).spacing);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"cannot change previously set vertex spacing",pcVar6,"");
      }
    }
    else {
      pcVar6 = TQualifier::getVertexSpacingString((publicType->shaderQualifiers).spacing);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to \'in\'",pcVar6,"");
    }
  }
  if ((publicType->shaderQualifiers).order != EvoNone) {
    if (((uint)*(undefined8 *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      bVar10 = TIntermediate::setVertexOrder
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                          (publicType->shaderQualifiers).order);
      if (!bVar10) {
        pcVar6 = TQualifier::getVertexOrderString((publicType->shaderQualifiers).order);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"cannot change previously set vertex order",pcVar6,"");
      }
    }
    else {
      pcVar6 = TQualifier::getVertexOrderString((publicType->shaderQualifiers).order);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to \'in\'",pcVar6,"");
    }
  }
  if (((publicType->shaderQualifiers).pointMode & 1U) != 0) {
    if (((uint)*(undefined8 *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      TIntermediate::setPointMode((this->super_TParseContextBase).super_TParseVersions.intermediate)
      ;
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to \'in\'","point_mode","");
    }
  }
  for (maxsErrtring.field_2._12_4_ = 0; (int)maxsErrtring.field_2._12_4_ < 3;
      maxsErrtring.field_2._12_4_ = maxsErrtring.field_2._12_4_ + 1) {
    if (((publicType->shaderQualifiers).localSizeNotDefault[(int)maxsErrtring.field_2._12_4_] & 1U)
        != 0) {
      if (((uint)*(undefined8 *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
        bVar10 = TIntermediate::setLocalSize
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                            maxsErrtring.field_2._12_4_,
                            (publicType->shaderQualifiers).localSize
                            [(int)maxsErrtring.field_2._12_4_]);
        if (bVar10) {
          maxsErrtring.field_2._8_4_ = 0;
          if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangCompute) {
            if (maxsErrtring.field_2._12_4_ == 0) {
              maxsErrtring.field_2._8_4_ = (this->resources).maxComputeWorkGroupSizeX;
            }
            else if (maxsErrtring.field_2._12_4_ == 1) {
              maxsErrtring.field_2._8_4_ = (this->resources).maxComputeWorkGroupSizeY;
            }
            else if (maxsErrtring.field_2._12_4_ == 2) {
              maxsErrtring.field_2._8_4_ = (this->resources).maxComputeWorkGroupSizeZ;
            }
            uVar1 = TIntermediate::getLocalSize
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                               maxsErrtring.field_2._12_4_);
            if ((uint)maxsErrtring.field_2._8_4_ < uVar1) {
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,"too large; see gl_MaxComputeWorkGroupSize","local_size","");
            }
          }
          else if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangMesh) {
            if (maxsErrtring.field_2._12_4_ == 0) {
              uVar1 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8]
                      )(this,"GL_EXT_mesh_shader");
              if ((uVar1 & 1) == 0) {
                local_134 = (this->resources).maxMeshWorkGroupSizeX_NV;
              }
              else {
                local_134 = (this->resources).maxMeshWorkGroupSizeX_EXT;
              }
              maxsErrtring.field_2._8_4_ = local_134;
            }
            else if (maxsErrtring.field_2._12_4_ == 1) {
              uVar1 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8]
                      )(this,"GL_EXT_mesh_shader");
              if ((uVar1 & 1) == 0) {
                local_138 = (this->resources).maxMeshWorkGroupSizeY_NV;
              }
              else {
                local_138 = (this->resources).maxMeshWorkGroupSizeY_EXT;
              }
              maxsErrtring.field_2._8_4_ = local_138;
            }
            else if (maxsErrtring.field_2._12_4_ == 2) {
              uVar1 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8]
                      )(this,"GL_EXT_mesh_shader");
              if ((uVar1 & 1) == 0) {
                local_13c = (this->resources).maxMeshWorkGroupSizeZ_NV;
              }
              else {
                local_13c = (this->resources).maxMeshWorkGroupSizeZ_EXT;
              }
              maxsErrtring.field_2._8_4_ = local_13c;
            }
            uVar1 = TIntermediate::getLocalSize
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                               maxsErrtring.field_2._12_4_);
            if ((uint)maxsErrtring.field_2._8_4_ < uVar1) {
              pool_allocator<char>::pool_allocator
                        ((pool_allocator<char> *)((long)&maxsErrtring_1.field_2 + 8));
              std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
              ::basic_string<glslang::std::allocator<char>>
                        ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                         local_60,"too large, see ",
                         (pool_allocator<char> *)((long)&maxsErrtring_1.field_2 + 8));
              uVar1 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8]
                      )(this,"GL_EXT_mesh_shader");
              pcVar6 = "gl_MaxMeshWorkGroupSizeNV";
              if ((uVar1 & 1) != 0) {
                pcVar6 = "gl_MaxMeshWorkGroupSizeEXT";
              }
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                        ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)local_60,pcVar6);
              pcVar6 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                       c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              *)local_60);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,pcVar6,"local_size","");
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
              ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)local_60);
            }
          }
          else {
            if ((this->super_TParseContextBase).super_TParseVersions.language != EShLangTask) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                            ,0x27e1,
                            "void glslang::TParseContext::updateStandaloneQualifierDefaults(const TSourceLoc &, const TPublicType &)"
                           );
            }
            if (maxsErrtring.field_2._12_4_ == 0) {
              uVar1 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8]
                      )(this,"GL_EXT_mesh_shader");
              if ((uVar1 & 1) == 0) {
                local_150 = (this->resources).maxTaskWorkGroupSizeX_NV;
              }
              else {
                local_150 = (this->resources).maxTaskWorkGroupSizeX_EXT;
              }
              maxsErrtring.field_2._8_4_ = local_150;
            }
            else if (maxsErrtring.field_2._12_4_ == 1) {
              uVar1 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8]
                      )(this,"GL_EXT_mesh_shader");
              if ((uVar1 & 1) == 0) {
                local_154 = (this->resources).maxTaskWorkGroupSizeY_NV;
              }
              else {
                local_154 = (this->resources).maxTaskWorkGroupSizeY_EXT;
              }
              maxsErrtring.field_2._8_4_ = local_154;
            }
            else if (maxsErrtring.field_2._12_4_ == 2) {
              uVar1 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8]
                      )(this,"GL_EXT_mesh_shader");
              if ((uVar1 & 1) == 0) {
                local_158 = (this->resources).maxTaskWorkGroupSizeZ_NV;
              }
              else {
                local_158 = (this->resources).maxTaskWorkGroupSizeZ_EXT;
              }
              maxsErrtring.field_2._8_4_ = local_158;
            }
            uVar1 = TIntermediate::getLocalSize
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                               maxsErrtring.field_2._12_4_);
            if ((uint)maxsErrtring.field_2._8_4_ < uVar1) {
              pool_allocator<char>::pool_allocator((pool_allocator<char> *)&workGroupSize);
              std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
              ::basic_string<glslang::std::allocator<char>>
                        ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                         local_90,"too large, see ",(pool_allocator<char> *)&workGroupSize);
              uVar1 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8]
                      )(this,"GL_EXT_mesh_shader");
              pcVar6 = "gl_MaxTaskWorkGroupSizeNV";
              if ((uVar1 & 1) != 0) {
                pcVar6 = "gl_MaxTaskWorkGroupSizeEXT";
              }
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                        ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)local_90,pcVar6);
              pcVar6 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                       c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              *)local_90);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,pcVar6,"local_size","");
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
              ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)local_90);
            }
          }
          iVar2 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4f])
                            ();
          if ((long *)CONCAT44(extraout_var,iVar2) != (long *)0x0) {
            this_00 = (TConstUnionArray *)
                      (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0xc0))();
            this_01 = TConstUnionArray::operator[](this_00,(long)(int)maxsErrtring.field_2._12_4_);
            uVar1 = TIntermediate::getLocalSize
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                               maxsErrtring.field_2._12_4_);
            TConstUnion::setUConst(this_01,uVar1);
          }
        }
        else {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"cannot change previously set size","local_size","");
        }
      }
      else {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"can only apply to \'in\'","local_size","");
      }
    }
    if ((publicType->shaderQualifiers).localSizeSpecId[(int)maxsErrtring.field_2._12_4_] != -1) {
      if (((uint)*(undefined8 *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
        bVar10 = TIntermediate::setLocalSizeSpecId
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                            maxsErrtring.field_2._12_4_,
                            (publicType->shaderQualifiers).localSizeSpecId
                            [(int)maxsErrtring.field_2._12_4_]);
        if (!bVar10) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"cannot change previously set size","local_size","");
        }
      }
      else {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"can only apply to \'in\'","local_size id","");
      }
      iVar2 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4f])();
      if ((long *)CONCAT44(extraout_var_00,iVar2) != (long *)0x0) {
        plVar8 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x68))();
        lVar9 = (**(code **)(*plVar8 + 0x50))();
        *(ulong *)(lVar9 + 8) = *(ulong *)(lVar9 + 8) & 0xfffffffeffffffff | 0x100000000;
      }
    }
  }
  if (((publicType->shaderQualifiers).earlyFragmentTests & 1U) != 0) {
    if (((uint)*(undefined8 *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      TIntermediate::setEarlyFragmentTests
                ((this->super_TParseContextBase).super_TParseVersions.intermediate);
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to \'in\'","early_fragment_tests","");
    }
  }
  if (((publicType->shaderQualifiers).earlyAndLateFragmentTestsAMD & 1U) != 0) {
    if (((uint)*(undefined8 *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      TIntermediate::setEarlyAndLateFragmentTestsAMD
                ((this->super_TParseContextBase).super_TParseVersions.intermediate);
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to \'in\'","early_and_late_fragment_tests_amd","");
    }
  }
  if (((publicType->shaderQualifiers).postDepthCoverage & 1U) != 0) {
    if (((uint)*(undefined8 *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      TIntermediate::setPostDepthCoverage
                ((this->super_TParseContextBase).super_TParseVersions.intermediate);
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to \'in\'","post_coverage_coverage","");
    }
  }
  if (((publicType->shaderQualifiers).nonCoherentColorAttachmentReadEXT & 1U) != 0) {
    if (((uint)*(undefined8 *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      TIntermediate::setNonCoherentColorAttachmentReadEXT
                ((this->super_TParseContextBase).super_TParseVersions.intermediate);
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to \'in\'","non_coherent_color_attachment_readEXT","");
    }
  }
  if (((publicType->shaderQualifiers).nonCoherentDepthAttachmentReadEXT & 1U) != 0) {
    if (((uint)*(undefined8 *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      TIntermediate::setNonCoherentDepthAttachmentReadEXT
                ((this->super_TParseContextBase).super_TParseVersions.intermediate);
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to \'in\'","non_coherent_depth_attachment_readEXT","");
    }
  }
  if (((publicType->shaderQualifiers).nonCoherentStencilAttachmentReadEXT & 1U) != 0) {
    if (((uint)*(undefined8 *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      TIntermediate::setNonCoherentStencilAttachmentReadEXT
                ((this->super_TParseContextBase).super_TParseVersions.intermediate);
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to \'in\'","non_coherent_stencil_attachment_readEXT","");
    }
  }
  bVar10 = TShaderQualifiers::hasBlendEquation(&publicType->shaderQualifiers);
  if ((bVar10) && (((uint)*(undefined8 *)&(publicType->qualifier).field_0x8 & 0x7f) != 4)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only apply to \'out\'","blend equation","");
  }
  if ((publicType->shaderQualifiers).interlockOrdering != EioNone) {
    if (((uint)*(undefined8 *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      bVar10 = TIntermediate::setInterlockOrdering
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                          (publicType->shaderQualifiers).interlockOrdering);
      if (!bVar10) {
        pcVar6 = TQualifier::getInterlockOrderingString
                           ((publicType->shaderQualifiers).interlockOrdering);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"cannot change previously set fragment shader interlock ordering",pcVar6
                   ,"");
      }
    }
    else {
      pcVar6 = TQualifier::getInterlockOrderingString
                         ((publicType->shaderQualifiers).interlockOrdering);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to \'in\'",pcVar6,"");
    }
  }
  if ((((publicType->shaderQualifiers).layoutDerivativeGroupQuads & 1U) != 0) &&
     (((publicType->shaderQualifiers).layoutDerivativeGroupLinear & 1U) != 0)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"cannot be both specified",
               "derivative_group_quadsNV and derivative_group_linearNV","");
  }
  if (((publicType->shaderQualifiers).layoutDerivativeGroupQuads & 1U) != 0) {
    if (((uint)*(undefined8 *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      iVar2 = TIntermediate::getLocalSizeSpecId
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,0);
      if (((iVar2 == -1) &&
          (uVar1 = TIntermediate::getLocalSize
                             ((this->super_TParseContextBase).super_TParseVersions.intermediate,0),
          (uVar1 & 1) != 0)) ||
         ((iVar2 = TIntermediate::getLocalSizeSpecId
                             ((this->super_TParseContextBase).super_TParseVersions.intermediate,1),
          iVar2 == -1 &&
          (uVar1 = TIntermediate::getLocalSize
                             ((this->super_TParseContextBase).super_TParseVersions.intermediate,1),
          (uVar1 & 1) != 0)))) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"requires local_size_x and local_size_y to be multiple of two",
                   "derivative_group_quadsNV","");
      }
      else {
        TIntermediate::setLayoutDerivativeMode
                  ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                   LayoutDerivativeGroupQuads);
      }
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to \'in\'","derivative_group_quadsNV","");
    }
  }
  if (((publicType->shaderQualifiers).layoutDerivativeGroupLinear & 1U) != 0) {
    if (((uint)*(undefined8 *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      iVar2 = TIntermediate::getLocalSizeSpecId
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,0);
      if (((iVar2 == -1) &&
          (iVar2 = TIntermediate::getLocalSizeSpecId
                             ((this->super_TParseContextBase).super_TParseVersions.intermediate,1),
          iVar2 == -1)) &&
         (iVar2 = TIntermediate::getLocalSizeSpecId
                            ((this->super_TParseContextBase).super_TParseVersions.intermediate,2),
         iVar2 == -1)) {
        uVar1 = TIntermediate::getLocalSize
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,0);
        uVar3 = TIntermediate::getLocalSize
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,1);
        uVar4 = TIntermediate::getLocalSize
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,2);
        if ((uVar1 * uVar3 * uVar4 & 3) != 0) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"requires total group size to be multiple of four",
                     "derivative_group_linearNV","");
          goto LAB_006ab320;
        }
      }
      TIntermediate::setLayoutDerivativeMode
                ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                 LayoutDerivativeGroupLinear);
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to \'in\'","derivative_group_linearNV","");
    }
  }
LAB_006ab320:
  if ((((this->super_TParseContextBase).super_TParseVersions.language == EShLangMesh) &&
      (iVar2 = TIntermediate::getVertices
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate),
      iVar2 != -1)) &&
     ((iVar2 = TIntermediate::getPrimitives
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate),
      iVar2 != -1 &&
      (TVar5 = TIntermediate::getOutputPrimitive
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate),
      TVar5 != ElgNone)))) {
    checkIoArraysConsistency(this,loc,false);
  }
  if (((publicType->shaderQualifiers).layoutPrimitiveCulling & 1U) == 0) {
    this_02 = &publicType->qualifier;
    bVar10 = TQualifier::isAuxiliary(this_02);
    if (((bVar10) || (bVar10 = TQualifier::isMemory(this_02), bVar10)) ||
       ((bVar10 = TQualifier::isInterpolation(this_02), bVar10 ||
        ((*(ulong *)&(publicType->qualifier).field_0x8 >> 0x19 & 7) != 0)))) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,
                 "cannot use auxiliary, memory, interpolation, or precision qualifier in a default qualifier declaration (declaration with no type)"
                 ,"qualifier","");
    }
    bVar10 = TQualifier::hasOffset(this_02);
    if ((bVar10) || (bVar10 = TQualifier::hasAlign(this_02), bVar10)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,
                 "cannot use offset or align qualifiers in a default qualifier declaration (declaration with no type)"
                 ,"layout qualifier","");
    }
    layoutQualifierCheck(this,loc,this_02);
    switch(*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) {
    case 3:
      break;
    case 4:
      bVar10 = TQualifier::hasStream(this_02);
      if (bVar10) {
        *(ulong *)&(this->globalOutputDefaults).field_0x1c =
             *(ulong *)&(this->globalOutputDefaults).field_0x1c & 0xffffffffffffff |
             *(ulong *)&(publicType->qualifier).field_0x1c & 0xff00000000000000;
      }
      bVar10 = TQualifier::hasXfbBuffer(this_02);
      if (bVar10) {
        *(ulong *)&(this->globalOutputDefaults).field_0x24 =
             *(ulong *)&(this->globalOutputDefaults).field_0x24 & 0xfffffffffffffff0 |
             (ulong)((uint)*(undefined8 *)&(publicType->qualifier).field_0x24 & 0xf);
      }
      bVar10 = TQualifier::hasXfbBuffer(&this->globalOutputDefaults);
      if (((bVar10) && (bVar10 = TQualifier::hasXfbStride(this_02), bVar10)) &&
         (bVar10 = TIntermediate::setXfbBufferStride
                             ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                              (uint)*(undefined8 *)&(this->globalOutputDefaults).field_0x24 & 0xf,
                              (uint)(*(ulong *)&(publicType->qualifier).field_0x24 >> 4) & 0x3fff),
         !bVar10)) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"all stride settings must match for xfb buffer","xfb_stride","%d",
                   (ulong)((uint)*(undefined8 *)&(publicType->qualifier).field_0x24 & 0xf));
      }
      break;
    case 5:
      bVar10 = TQualifier::hasMatrix(this_02);
      if (bVar10) {
        *(ulong *)&(this->globalUniformDefaults).field_0x8 =
             *(ulong *)&(this->globalUniformDefaults).field_0x8 & 0x1fffffffffffffff |
             *(ulong *)&(publicType->qualifier).field_0x8 & 0xe000000000000000;
      }
      bVar10 = TQualifier::hasPacking(this_02);
      if (bVar10) {
        (this->globalUniformDefaults).field_0x10 =
             (this->globalUniformDefaults).field_0x10 & 0xf0 |
             (publicType->qualifier).field_0x10 & 0xf;
      }
      break;
    case 6:
      bVar10 = TQualifier::hasMatrix(this_02);
      if (bVar10) {
        *(ulong *)&(this->globalBufferDefaults).field_0x8 =
             *(ulong *)&(this->globalBufferDefaults).field_0x8 & 0x1fffffffffffffff |
             *(ulong *)&(publicType->qualifier).field_0x8 & 0xe000000000000000;
      }
      bVar10 = TQualifier::hasPacking(this_02);
      if (bVar10) {
        (this->globalBufferDefaults).field_0x10 =
             (this->globalBufferDefaults).field_0x10 & 0xf0 |
             (publicType->qualifier).field_0x10 & 0xf;
      }
      break;
    case 7:
      bVar10 = TQualifier::hasMatrix(this_02);
      if (bVar10) {
        *(ulong *)&(this->globalSharedDefaults).field_0x8 =
             *(ulong *)&(this->globalSharedDefaults).field_0x8 & 0x1fffffffffffffff |
             *(ulong *)&(publicType->qualifier).field_0x8 & 0xe000000000000000;
      }
      bVar10 = TQualifier::hasPacking(this_02);
      if (bVar10) {
        (this->globalSharedDefaults).field_0x10 =
             (this->globalSharedDefaults).field_0x10 & 0xf0 |
             (publicType->qualifier).field_0x10 & 0xf;
      }
      break;
    default:
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,
                 "default qualifier requires \'uniform\', \'buffer\', \'in\', \'out\' or \'shared\' storage qualification"
                 ,"");
      return;
    }
    bVar10 = TQualifier::hasBinding(this_02);
    if (bVar10) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot declare a default, include a type or full declaration","binding",
                 "");
    }
    bVar10 = TQualifier::hasAnyLocation(this_02);
    if (bVar10) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot declare a default, use a full declaration",
                 "location/component/index","");
    }
    bVar10 = TQualifier::hasXfbOffset(this_02);
    if (bVar10) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot declare a default, use a full declaration","xfb_offset","");
    }
    bVar10 = TQualifier::isPushConstant(this_02);
    if (bVar10) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot declare a default, can only be used on a block","push_constant",""
                );
    }
    bVar10 = TQualifier::hasBufferReference(this_02);
    if (bVar10) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot declare a default, can only be used on a block","buffer_reference"
                 ,"");
    }
    bVar10 = TQualifier::hasSpecConstantId(this_02);
    if (bVar10) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot declare a default, can only be used on a scalar","constant_id","")
      ;
    }
    bVar10 = TQualifier::isShaderRecord(this_02);
    if (bVar10) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot declare a default, can only be used on a block","shaderRecordNV",
                 "");
    }
  }
  else if ((*(ulong *)&(publicType->qualifier).field_0x8 & 0x7f) == 0) {
    TIntermediate::setLayoutPrimitiveCulling
              ((this->super_TParseContextBase).super_TParseVersions.intermediate);
  }
  else {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"layout qualifier cannot have storage qualifiers","primitive_culling","");
  }
  return;
}

Assistant:

void TParseContext::updateStandaloneQualifierDefaults(const TSourceLoc& loc, const TPublicType& publicType)
{
    if (publicType.shaderQualifiers.vertices != TQualifier::layoutNotSet) {
        assert(language == EShLangTessControl || language == EShLangGeometry || language == EShLangMesh);
        const char* id = (language == EShLangTessControl) ? "vertices" : "max_vertices";

        if (publicType.qualifier.storage != EvqVaryingOut)
            error(loc, "can only apply to 'out'", id, "");
        if (! intermediate.setVertices(publicType.shaderQualifiers.vertices))
            error(loc, "cannot change previously set layout value", id, "");

        if (language == EShLangTessControl)
            checkIoArraysConsistency(loc);
    }
    if (publicType.shaderQualifiers.primitives != TQualifier::layoutNotSet) {
        assert(language == EShLangMesh);
        const char* id = "max_primitives";

        if (publicType.qualifier.storage != EvqVaryingOut)
            error(loc, "can only apply to 'out'", id, "");
        if (! intermediate.setPrimitives(publicType.shaderQualifiers.primitives))
            error(loc, "cannot change previously set layout value", id, "");
    }
    if (publicType.shaderQualifiers.invocations != TQualifier::layoutNotSet) {
        if (publicType.qualifier.storage != EvqVaryingIn)
            error(loc, "can only apply to 'in'", "invocations", "");
        if (! intermediate.setInvocations(publicType.shaderQualifiers.invocations))
            error(loc, "cannot change previously set layout value", "invocations", "");
    }
    if (publicType.shaderQualifiers.geometry != ElgNone) {
        if (publicType.qualifier.storage == EvqVaryingIn) {
            switch (publicType.shaderQualifiers.geometry) {
            case ElgPoints:
            case ElgLines:
            case ElgLinesAdjacency:
            case ElgTriangles:
            case ElgTrianglesAdjacency:
            case ElgQuads:
            case ElgIsolines:
                if (language == EShLangMesh) {
                    error(loc, "cannot apply to input", TQualifier::getGeometryString(publicType.shaderQualifiers.geometry), "");
                    break;
                }
                if (intermediate.setInputPrimitive(publicType.shaderQualifiers.geometry)) {
                    if (language == EShLangGeometry)
                        checkIoArraysConsistency(loc);
                } else
                    error(loc, "cannot change previously set input primitive", TQualifier::getGeometryString(publicType.shaderQualifiers.geometry), "");
                break;
            default:
                error(loc, "cannot apply to input", TQualifier::getGeometryString(publicType.shaderQualifiers.geometry), "");
            }
        } else if (publicType.qualifier.storage == EvqVaryingOut) {
            switch (publicType.shaderQualifiers.geometry) {
            case ElgLines:
            case ElgTriangles:
                if (language != EShLangMesh) {
                    error(loc, "cannot apply to 'out'", TQualifier::getGeometryString(publicType.shaderQualifiers.geometry), "");
                    break;
                }
                [[fallthrough]];
            case ElgPoints:
            case ElgLineStrip:
            case ElgTriangleStrip:
                if (! intermediate.setOutputPrimitive(publicType.shaderQualifiers.geometry))
                    error(loc, "cannot change previously set output primitive", TQualifier::getGeometryString(publicType.shaderQualifiers.geometry), "");
                break;
            default:
                error(loc, "cannot apply to 'out'", TQualifier::getGeometryString(publicType.shaderQualifiers.geometry), "");
            }
        } else
            error(loc, "cannot apply to:", TQualifier::getGeometryString(publicType.shaderQualifiers.geometry), GetStorageQualifierString(publicType.qualifier.storage));
    }
    if (publicType.shaderQualifiers.spacing != EvsNone) {
        if (publicType.qualifier.storage == EvqVaryingIn) {
            if (! intermediate.setVertexSpacing(publicType.shaderQualifiers.spacing))
                error(loc, "cannot change previously set vertex spacing", TQualifier::getVertexSpacingString(publicType.shaderQualifiers.spacing), "");
        } else
            error(loc, "can only apply to 'in'", TQualifier::getVertexSpacingString(publicType.shaderQualifiers.spacing), "");
    }
    if (publicType.shaderQualifiers.order != EvoNone) {
        if (publicType.qualifier.storage == EvqVaryingIn) {
            if (! intermediate.setVertexOrder(publicType.shaderQualifiers.order))
                error(loc, "cannot change previously set vertex order", TQualifier::getVertexOrderString(publicType.shaderQualifiers.order), "");
        } else
            error(loc, "can only apply to 'in'", TQualifier::getVertexOrderString(publicType.shaderQualifiers.order), "");
    }
    if (publicType.shaderQualifiers.pointMode) {
        if (publicType.qualifier.storage == EvqVaryingIn)
            intermediate.setPointMode();
        else
            error(loc, "can only apply to 'in'", "point_mode", "");
    }

    for (int i = 0; i < 3; ++i) {
        if (publicType.shaderQualifiers.localSizeNotDefault[i]) {
            if (publicType.qualifier.storage == EvqVaryingIn) {
                if (! intermediate.setLocalSize(i, publicType.shaderQualifiers.localSize[i]))
                    error(loc, "cannot change previously set size", "local_size", "");
                else {
                    int max = 0;
                    if (language == EShLangCompute) {
                        switch (i) {
                        case 0: max = resources.maxComputeWorkGroupSizeX; break;
                        case 1: max = resources.maxComputeWorkGroupSizeY; break;
                        case 2: max = resources.maxComputeWorkGroupSizeZ; break;
                        default: break;
                        }
                        if (intermediate.getLocalSize(i) > (unsigned int)max)
                            error(loc, "too large; see gl_MaxComputeWorkGroupSize", "local_size", "");
                    } else if (language == EShLangMesh) {
                        switch (i) {
                        case 0:
                            max = extensionTurnedOn(E_GL_EXT_mesh_shader) ?
                                    resources.maxMeshWorkGroupSizeX_EXT :
                                    resources.maxMeshWorkGroupSizeX_NV;
                            break;
                        case 1:
                            max = extensionTurnedOn(E_GL_EXT_mesh_shader) ?
                                    resources.maxMeshWorkGroupSizeY_EXT :
                                    resources.maxMeshWorkGroupSizeY_NV ;
                            break;
                        case 2:
                            max = extensionTurnedOn(E_GL_EXT_mesh_shader) ?
                                    resources.maxMeshWorkGroupSizeZ_EXT :
                                    resources.maxMeshWorkGroupSizeZ_NV ;
                            break;
                        default: break;
                        }
                        if (intermediate.getLocalSize(i) > (unsigned int)max) {
                            TString maxsErrtring = "too large, see ";
                            maxsErrtring.append(extensionTurnedOn(E_GL_EXT_mesh_shader) ?
                                                    "gl_MaxMeshWorkGroupSizeEXT" : "gl_MaxMeshWorkGroupSizeNV");
                            error(loc, maxsErrtring.c_str(), "local_size", "");
                        }
                    } else if (language == EShLangTask) {
                        switch (i) {
                        case 0:
                            max = extensionTurnedOn(E_GL_EXT_mesh_shader) ?
                                    resources.maxTaskWorkGroupSizeX_EXT :
                                    resources.maxTaskWorkGroupSizeX_NV;
                            break;
                        case 1:
                            max = extensionTurnedOn(E_GL_EXT_mesh_shader) ?
                                    resources.maxTaskWorkGroupSizeY_EXT:
                                    resources.maxTaskWorkGroupSizeY_NV;
                            break;
                        case 2:
                            max = extensionTurnedOn(E_GL_EXT_mesh_shader) ?
                                    resources.maxTaskWorkGroupSizeZ_EXT:
                                    resources.maxTaskWorkGroupSizeZ_NV;
                            break;
                        default: break;
                        }
                        if (intermediate.getLocalSize(i) > (unsigned int)max) {
                            TString maxsErrtring = "too large, see ";
                            maxsErrtring.append(extensionTurnedOn(E_GL_EXT_mesh_shader) ?
                                                    "gl_MaxTaskWorkGroupSizeEXT" : "gl_MaxTaskWorkGroupSizeNV");
                            error(loc, maxsErrtring.c_str(), "local_size", "");
                        }
                    } else {
                        assert(0);
                    }

                    // Fix the existing constant gl_WorkGroupSize with this new information.
                    TVariable* workGroupSize = getEditableVariable("gl_WorkGroupSize");
                    if (workGroupSize != nullptr)
                        workGroupSize->getWritableConstArray()[i].setUConst(intermediate.getLocalSize(i));
                }
            } else
                error(loc, "can only apply to 'in'", "local_size", "");
        }
        if (publicType.shaderQualifiers.localSizeSpecId[i] != TQualifier::layoutNotSet) {
            if (publicType.qualifier.storage == EvqVaryingIn) {
                if (! intermediate.setLocalSizeSpecId(i, publicType.shaderQualifiers.localSizeSpecId[i]))
                    error(loc, "cannot change previously set size", "local_size", "");
            } else
                error(loc, "can only apply to 'in'", "local_size id", "");
            // Set the workgroup built-in variable as a specialization constant
            TVariable* workGroupSize = getEditableVariable("gl_WorkGroupSize");
            if (workGroupSize != nullptr)
                workGroupSize->getWritableType().getQualifier().specConstant = true;
        }
    }

    if (publicType.shaderQualifiers.earlyFragmentTests) {
        if (publicType.qualifier.storage == EvqVaryingIn)
            intermediate.setEarlyFragmentTests();
        else
            error(loc, "can only apply to 'in'", "early_fragment_tests", "");
    }
    if (publicType.shaderQualifiers.earlyAndLateFragmentTestsAMD) {
        if (publicType.qualifier.storage == EvqVaryingIn)
            intermediate.setEarlyAndLateFragmentTestsAMD();
        else
            error(loc, "can only apply to 'in'", "early_and_late_fragment_tests_amd", "");
    }
    if (publicType.shaderQualifiers.postDepthCoverage) {
        if (publicType.qualifier.storage == EvqVaryingIn)
            intermediate.setPostDepthCoverage();
        else
            error(loc, "can only apply to 'in'", "post_coverage_coverage", "");
    }
    if (publicType.shaderQualifiers.nonCoherentColorAttachmentReadEXT) {
        if (publicType.qualifier.storage == EvqVaryingIn)
            intermediate.setNonCoherentColorAttachmentReadEXT();
        else
            error(loc, "can only apply to 'in'", "non_coherent_color_attachment_readEXT", "");
    }
    if (publicType.shaderQualifiers.nonCoherentDepthAttachmentReadEXT) {
        if (publicType.qualifier.storage == EvqVaryingIn)
            intermediate.setNonCoherentDepthAttachmentReadEXT();
        else
            error(loc, "can only apply to 'in'", "non_coherent_depth_attachment_readEXT", "");
    }
    if (publicType.shaderQualifiers.nonCoherentStencilAttachmentReadEXT) {
        if (publicType.qualifier.storage == EvqVaryingIn)
            intermediate.setNonCoherentStencilAttachmentReadEXT();
        else
            error(loc, "can only apply to 'in'", "non_coherent_stencil_attachment_readEXT", "");
    }
    if (publicType.shaderQualifiers.hasBlendEquation()) {
        if (publicType.qualifier.storage != EvqVaryingOut)
            error(loc, "can only apply to 'out'", "blend equation", "");
    }
    if (publicType.shaderQualifiers.interlockOrdering) {
        if (publicType.qualifier.storage == EvqVaryingIn) {
            if (!intermediate.setInterlockOrdering(publicType.shaderQualifiers.interlockOrdering))
                error(loc, "cannot change previously set fragment shader interlock ordering", TQualifier::getInterlockOrderingString(publicType.shaderQualifiers.interlockOrdering), "");
        }
        else
            error(loc, "can only apply to 'in'", TQualifier::getInterlockOrderingString(publicType.shaderQualifiers.interlockOrdering), "");
    }

    if (publicType.shaderQualifiers.layoutDerivativeGroupQuads &&
        publicType.shaderQualifiers.layoutDerivativeGroupLinear) {
        error(loc, "cannot be both specified", "derivative_group_quadsNV and derivative_group_linearNV", "");
    }

    if (publicType.shaderQualifiers.layoutDerivativeGroupQuads) {
        if (publicType.qualifier.storage == EvqVaryingIn) {
            if ((intermediate.getLocalSizeSpecId(0) == TQualifier::layoutNotSet && (intermediate.getLocalSize(0) & 1)) ||
                (intermediate.getLocalSizeSpecId(1) == TQualifier::layoutNotSet && (intermediate.getLocalSize(1) & 1)))
                error(loc, "requires local_size_x and local_size_y to be multiple of two", "derivative_group_quadsNV", "");
            else
                intermediate.setLayoutDerivativeMode(LayoutDerivativeGroupQuads);
        }
        else
            error(loc, "can only apply to 'in'", "derivative_group_quadsNV", "");
    }
    if (publicType.shaderQualifiers.layoutDerivativeGroupLinear) {
        if (publicType.qualifier.storage == EvqVaryingIn) {
            if (intermediate.getLocalSizeSpecId(0) == TQualifier::layoutNotSet &&
                intermediate.getLocalSizeSpecId(1) == TQualifier::layoutNotSet &&
                intermediate.getLocalSizeSpecId(2) == TQualifier::layoutNotSet &&
                (intermediate.getLocalSize(0) *
                intermediate.getLocalSize(1) *
                intermediate.getLocalSize(2)) % 4 != 0)
                error(loc, "requires total group size to be multiple of four", "derivative_group_linearNV", "");
            else
                intermediate.setLayoutDerivativeMode(LayoutDerivativeGroupLinear);
        }
        else
            error(loc, "can only apply to 'in'", "derivative_group_linearNV", "");
    }
    // Check mesh out array sizes, once all the necessary out qualifiers are defined.
    if ((language == EShLangMesh) &&
        (intermediate.getVertices() != TQualifier::layoutNotSet) &&
        (intermediate.getPrimitives() != TQualifier::layoutNotSet) &&
        (intermediate.getOutputPrimitive() != ElgNone))
    {
        checkIoArraysConsistency(loc);
    }

    if (publicType.shaderQualifiers.layoutPrimitiveCulling) {
        if (publicType.qualifier.storage != EvqTemporary)
            error(loc, "layout qualifier cannot have storage qualifiers", "primitive_culling", "", "");
        else {
            intermediate.setLayoutPrimitiveCulling();
        }
        // Exit early as further checks are not valid
        return;
    }

    const TQualifier& qualifier = publicType.qualifier;

    if (qualifier.isAuxiliary() ||
        qualifier.isMemory() ||
        qualifier.isInterpolation() ||
        qualifier.precision != EpqNone)
        error(loc, "cannot use auxiliary, memory, interpolation, or precision qualifier in a default qualifier declaration (declaration with no type)", "qualifier", "");

    // "The offset qualifier can only be used on block members of blocks..."
    // "The align qualifier can only be used on blocks or block members..."
    if (qualifier.hasOffset() ||
        qualifier.hasAlign())
        error(loc, "cannot use offset or align qualifiers in a default qualifier declaration (declaration with no type)", "layout qualifier", "");

    layoutQualifierCheck(loc, qualifier);

    switch (qualifier.storage) {
    case EvqUniform:
        if (qualifier.hasMatrix())
            globalUniformDefaults.layoutMatrix = qualifier.layoutMatrix;
        if (qualifier.hasPacking())
            globalUniformDefaults.layoutPacking = qualifier.layoutPacking;
        break;
    case EvqBuffer:
        if (qualifier.hasMatrix())
            globalBufferDefaults.layoutMatrix = qualifier.layoutMatrix;
        if (qualifier.hasPacking())
            globalBufferDefaults.layoutPacking = qualifier.layoutPacking;
        break;
    case EvqVaryingIn:
        break;
    case EvqVaryingOut:
        if (qualifier.hasStream())
            globalOutputDefaults.layoutStream = qualifier.layoutStream;
        if (qualifier.hasXfbBuffer())
            globalOutputDefaults.layoutXfbBuffer = qualifier.layoutXfbBuffer;
        if (globalOutputDefaults.hasXfbBuffer() && qualifier.hasXfbStride()) {
            if (! intermediate.setXfbBufferStride(globalOutputDefaults.layoutXfbBuffer, qualifier.layoutXfbStride))
                error(loc, "all stride settings must match for xfb buffer", "xfb_stride", "%d", qualifier.layoutXfbBuffer);
        }
        break;
    case EvqShared:
        if (qualifier.hasMatrix())
            globalSharedDefaults.layoutMatrix = qualifier.layoutMatrix;
        if (qualifier.hasPacking())
            globalSharedDefaults.layoutPacking = qualifier.layoutPacking;
        break;
    default:
        error(loc, "default qualifier requires 'uniform', 'buffer', 'in', 'out' or 'shared' storage qualification", "", "");
        return;
    }

    if (qualifier.hasBinding())
        error(loc, "cannot declare a default, include a type or full declaration", "binding", "");
    if (qualifier.hasAnyLocation())
        error(loc, "cannot declare a default, use a full declaration", "location/component/index", "");
    if (qualifier.hasXfbOffset())
        error(loc, "cannot declare a default, use a full declaration", "xfb_offset", "");
    if (qualifier.isPushConstant())
        error(loc, "cannot declare a default, can only be used on a block", "push_constant", "");
    if (qualifier.hasBufferReference())
        error(loc, "cannot declare a default, can only be used on a block", "buffer_reference", "");
    if (qualifier.hasSpecConstantId())
        error(loc, "cannot declare a default, can only be used on a scalar", "constant_id", "");
    if (qualifier.isShaderRecord())
        error(loc, "cannot declare a default, can only be used on a block", "shaderRecordNV", "");
}